

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_object.c
# Opt level: O0

int object_delete(object obj)

{
  int iVar1;
  undefined8 *in_RDI;
  int error;
  int local_4;
  
  if (((in_RDI == (undefined8 *)0x0) || (in_RDI[3] == 0)) || (*(long *)(in_RDI[3] + 0x28) == 0)) {
    local_4 = 1;
  }
  else {
    iVar1 = (**(code **)(in_RDI[3] + 0x28))(in_RDI,in_RDI[2]);
    if (iVar1 == 0) {
      local_4 = 0;
    }
    else {
      log_write_impl_va("metacall",0x174,"object_delete",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/reflect/source/reflect_object.c"
                        ,3,"Invalid object %s destructor",*in_RDI);
      local_4 = 2;
    }
  }
  return local_4;
}

Assistant:

int object_delete(object obj)
{
	if (obj != NULL && obj->interface != NULL && obj->interface->destructor != NULL)
	{
		int error = obj->interface->destructor(obj, obj->impl);

		if (error != 0)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Invalid object %s destructor", obj->name);

			return 2;
		}

		return 0;
	}

	return 1;
}